

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

void __thiscall pbrt::ProjectiveCamera::InitMetadata(ProjectiveCamera *this,ImageMetadata *metadata)

{
  Vector3f delta;
  Transform NDCFromWorld;
  Transform local_338;
  Transform local_2b0;
  Transform local_230;
  Transform local_1b0;
  Transform local_130;
  Transform local_b0;
  
  AnimatedTransform::Interpolate
            (&local_2b0,(AnimatedTransform *)this,(this->super_CameraBase).shutterOpen);
  Transform::operator*
            (&local_230,&(this->super_CameraBase).cameraTransform.worldFromRender,&local_2b0);
  local_338.m.m[0][0] = local_230.mInv.m[0][0];
  local_338.m.m[0][1] = local_230.mInv.m[0][1];
  local_338.m.m[0][2] = local_230.mInv.m[0][2];
  local_338.m.m[0][3] = local_230.mInv.m[0][3];
  local_338.m.m[1][0] = local_230.mInv.m[1][0];
  local_338.m.m[1][1] = local_230.mInv.m[1][1];
  local_338.m.m[1][2] = local_230.mInv.m[1][2];
  local_338.m.m[1][3] = local_230.mInv.m[1][3];
  local_338.m.m[2][0] = local_230.mInv.m[2][0];
  local_338.m.m[2][1] = local_230.mInv.m[2][1];
  local_338.m.m[2][2] = local_230.mInv.m[2][2];
  local_338.m.m[2][3] = local_230.mInv.m[2][3];
  local_338.m.m[3][0] = local_230.mInv.m[3][0];
  local_338.m.m[3][1] = local_230.mInv.m[3][1];
  local_338.m.m[3][2] = local_230.mInv.m[3][2];
  local_338.m.m[3][3] = local_230.mInv.m[3][3];
  local_338.mInv.m[0][0] = local_230.m.m[0][0];
  local_338.mInv.m[0][1] = local_230.m.m[0][1];
  local_338.mInv.m[0][2] = local_230.m.m[0][2];
  local_338.mInv.m[0][3] = local_230.m.m[0][3];
  local_338.mInv.m[1][0] = local_230.m.m[1][0];
  local_338.mInv.m[1][1] = local_230.m.m[1][1];
  local_338.mInv.m[1][2] = local_230.m.m[1][2];
  local_338.mInv.m[1][3] = local_230.m.m[1][3];
  local_338.mInv.m[2][0] = local_230.m.m[2][0];
  local_338.mInv.m[2][1] = local_230.m.m[2][1];
  local_338.mInv.m[2][2] = local_230.m.m[2][2];
  local_338.mInv.m[2][3] = local_230.m.m[2][3];
  local_338.mInv.m[3][0] = local_230.m.m[3][0];
  local_338.mInv.m[3][1] = local_230.m.m[3][1];
  local_338.mInv.m[3][2] = local_230.m.m[3][2];
  local_338.mInv.m[3][3] = local_230.m.m[3][3];
  if ((metadata->cameraFromWorld).set == true) {
    (metadata->cameraFromWorld).set = false;
  }
  *(undefined8 *)&(metadata->cameraFromWorld).optionalValue = local_230.mInv.m[0]._0_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 8) = local_230.mInv.m[0]._8_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x10) =
       local_230.mInv.m[1]._0_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x18) =
       local_230.mInv.m[1]._8_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x20) =
       local_230.mInv.m[2]._0_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x28) =
       local_230.mInv.m[2]._8_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x30) =
       local_230.mInv.m[3]._0_8_;
  *(undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + 0x38) =
       local_230.mInv.m[3]._8_8_;
  (metadata->cameraFromWorld).set = true;
  delta.super_Tuple3<pbrt::Vector3,_float>.z = 0.5;
  delta.super_Tuple3<pbrt::Vector3,_float>.x = 0.5;
  delta.super_Tuple3<pbrt::Vector3,_float>.y = 0.5;
  Translate(&local_b0,delta);
  Scale(&local_130,0.5,0.5,0.5);
  Transform::operator*(&local_338,&local_b0,&local_130);
  Transform::operator*(&local_2b0,&local_338,&this->screenFromCamera);
  if ((metadata->cameraFromWorld).set != false) {
    Transform::Transform(&local_1b0,(SquareMatrix<4> *)&metadata->cameraFromWorld);
    Transform::operator*(&local_230,&local_2b0,&local_1b0);
    if ((metadata->NDCFromWorld).set == true) {
      (metadata->NDCFromWorld).set = false;
    }
    *(undefined8 *)&(metadata->NDCFromWorld).optionalValue = local_230.m.m[0]._0_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 8) = local_230.m.m[0]._8_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x10) = local_230.m.m[1]._0_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x18) = local_230.m.m[1]._8_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x20) = local_230.m.m[2]._0_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x28) = local_230.m.m[2]._8_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x30) = local_230.m.m[3]._0_8_;
    *(undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + 0x38) = local_230.m.m[3]._8_8_;
    (metadata->NDCFromWorld).set = true;
    CameraBase::InitMetadata(&this->super_CameraBase,metadata);
    return;
  }
  LogFatal<char_const(&)[4]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
             ,0xea,"Check failed: %s",(char (*) [4])0x2813e7c);
}

Assistant:

void ProjectiveCamera::InitMetadata(ImageMetadata *metadata) const {
    metadata->cameraFromWorld = cameraTransform.CameraFromWorld(shutterOpen).GetMatrix();

    // TODO: double check this
    Transform NDCFromWorld = Translate(Vector3f(0.5, 0.5, 0.5)) * Scale(0.5, 0.5, 0.5) *
                             screenFromCamera * *metadata->cameraFromWorld;
    metadata->NDCFromWorld = NDCFromWorld.GetMatrix();

    CameraBase::InitMetadata(metadata);
}